

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O0

int loguru::init(EVP_PKEY_CTX *ctx)

{
  FILE *__stream;
  Verbosity VVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  size_t sVar5;
  long *in_RDX;
  char **in_RSI;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  char local_128 [8];
  char preamble_explain [92];
  char *main_thread_name;
  string local_b8;
  int local_94;
  int i;
  Text error_text;
  Text user_msg_1;
  Text fail_info_1;
  Text str_right_1;
  Text str_left_1;
  void *val_right_1;
  char *val_left_1;
  Text user_msg;
  Text fail_info;
  Text local_38;
  Text str_right;
  Text str_left;
  int val_right;
  int val_left;
  Options *options_local;
  char **argv_local;
  int *argc_local;
  
  str_left._str._4_4_ = *(int *)ctx;
  str_left._str._0_4_ = 0;
  if (str_left._str._4_4_ < 1) {
    format_value<int>((loguru *)&str_right,(int *)((long)&str_left._str + 4));
    format_value<int>((loguru *)&local_38,(int *)&str_left);
    pcVar3 = Text::c_str(&str_right);
    pcVar4 = Text::c_str(&local_38);
    textprintf((char *)&user_msg,"CHECK FAILED:  %s %s %s  (%s %s %s)  ","argc",">","0",pcVar3,">",
               pcVar4);
    textprintf((char *)&val_left_1,"Expected proper argc/argv");
    pcVar3 = Text::c_str(&user_msg);
    pcVar4 = Text::c_str((Text *)&val_left_1);
    log_and_abort(0,pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/strandborg[P]AlsavoCtrl/loguru.cpp"
                  ,0x24c,"%s",pcVar4);
  }
  if (in_RSI[*(int *)ctx] == (char *)0x0) {
    pcVar3 = filename(*in_RSI);
    std::__cxx11::string::operator=((string *)s_argv0_filename_abi_cxx11_,pcVar3);
    pcVar3 = getcwd(s_current_dir,0x1000);
    if (pcVar3 == (char *)0x0) {
      errno_as_text();
      VVar1 = current_verbosity_cutoff();
      if (-2 < VVar1) {
        Text::c_str((Text *)&stack0xffffffffffffff70);
        log(__x);
      }
      Text::~Text((Text *)&stack0xffffffffffffff70);
    }
    std::__cxx11::string::operator=((string *)s_arguments_abi_cxx11_,"");
    for (local_94 = 0; local_94 < *(int *)ctx; local_94 = local_94 + 1) {
      pcVar3 = in_RSI[local_94];
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_b8,pcVar3,(allocator *)((long)&main_thread_name + 7));
      escape((string *)s_arguments_abi_cxx11_,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&main_thread_name + 7));
      if (local_94 + 1 < *(int *)ctx) {
        std::__cxx11::string::operator+=((string *)s_arguments_abi_cxx11_," ");
      }
    }
    if (*in_RDX != 0) {
      parse_args((int *)ctx,in_RSI,(char *)*in_RDX);
    }
    unique0x00012000 = (char *)in_RDX[1];
    if (unique0x00012000 != (char *)0x0) {
      set_thread_name(unique0x00012000);
    }
    if (-1 < g_stderr_verbosity) {
      if ((g_preamble_header & 1) != 0) {
        print_preamble_header(local_128,0x5c);
        __stream = _stderr;
        if (((g_colorlogtostderr & 1) == 0) || ((s_terminal_has_color & 1) == 0)) {
          fprintf(_stderr,"%s\n",local_128);
        }
        else {
          pcVar3 = terminal_reset();
          pcVar4 = terminal_dim();
          fprintf(__stream,"%s%s%s\n",pcVar3,pcVar4,local_128);
        }
      }
      fflush(_stderr);
    }
    iVar2 = g_internal_verbosity;
    VVar1 = current_verbosity_cutoff();
    if (iVar2 <= VVar1) {
      __x_00 = (double)std::__cxx11::string::c_str();
      log(__x_00);
    }
    sVar5 = strlen(s_current_dir);
    iVar2 = g_internal_verbosity;
    if ((sVar5 != 0) && (VVar1 = current_verbosity_cutoff(), iVar2 <= VVar1)) {
      log(__x_01);
    }
    iVar2 = g_internal_verbosity;
    VVar1 = current_verbosity_cutoff();
    if (iVar2 <= VVar1) {
      log(__x_02);
    }
    iVar2 = g_internal_verbosity;
    VVar1 = current_verbosity_cutoff();
    if (iVar2 <= VVar1) {
      log(__x_03);
    }
    install_signal_handlers((SignalOptions *)(in_RDX + 2));
    iVar2 = atexit(on_atexit);
    return iVar2;
  }
  format_value<char*>(&str_right_1._str);
  format_value<decltype(nullptr)>(&fail_info_1._str);
  pcVar3 = Text::c_str(&str_right_1);
  pcVar4 = Text::c_str(&fail_info_1);
  textprintf((char *)&user_msg_1,"CHECK FAILED:  %s %s %s  (%s %s %s)  ","argv[argc]","==","nullptr"
             ,pcVar3,"==",pcVar4);
  textprintf((char *)&error_text,"Expected proper argc/argv");
  pcVar3 = Text::c_str(&user_msg_1);
  pcVar4 = Text::c_str(&error_text);
  log_and_abort(0,pcVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/strandborg[P]AlsavoCtrl/loguru.cpp"
                ,0x24d,"%s",pcVar4);
}

Assistant:

void init(int& argc, char* argv[], const Options& options)
	{
		CHECK_GT_F(argc,       0,       "Expected proper argc/argv");
		CHECK_EQ_F(argv[argc], nullptr, "Expected proper argc/argv");

		s_argv0_filename = filename(argv[0]);

		#ifdef _WIN32
			#define getcwd _getcwd
		#endif

		if (!getcwd(s_current_dir, sizeof(s_current_dir))) {
			const auto error_text = errno_as_text();
			LOG_F(WARNING, "Failed to get current working directory: " LOGURU_FMT(s) "", error_text.c_str());
		}

		s_arguments = "";
		for (int i = 0; i < argc; ++i) {
			escape(s_arguments, argv[i]);
			if (i + 1 < argc) {
				s_arguments += " ";
			}
		}

		if (options.verbosity_flag) {
			parse_args(argc, argv, options.verbosity_flag);
		}

		if (const auto main_thread_name = options.main_thread_name) {
			#if LOGURU_PTLS_NAMES || LOGURU_WINTHREADS
				set_thread_name(main_thread_name);
			#elif LOGURU_PTHREADS
				char old_thread_name[16] = {0};
				auto this_thread = pthread_self();
				#if defined(__APPLE__) || defined(__linux__) || defined(__sun)
					pthread_getname_np(this_thread, old_thread_name, sizeof(old_thread_name));
				#endif
				if (old_thread_name[0] == 0) {
					#ifdef __APPLE__
						pthread_setname_np(main_thread_name);
					#elif defined(__FreeBSD__) || defined(__OpenBSD__)
						pthread_set_name_np(this_thread, main_thread_name);
					#elif defined(__linux__) || defined(__sun)
						pthread_setname_np(this_thread, main_thread_name);
					#endif
				}
			#endif // LOGURU_PTHREADS
		}

		if (g_stderr_verbosity >= Verbosity_INFO) {
			if (g_preamble_header) {
				char preamble_explain[LOGURU_PREAMBLE_WIDTH];
				print_preamble_header(preamble_explain, sizeof(preamble_explain));
				if (g_colorlogtostderr && s_terminal_has_color) {
					fprintf(stderr, "%s%s%s\n", terminal_reset(), terminal_dim(), preamble_explain);
				} else {
					fprintf(stderr, "%s\n", preamble_explain);
				}
			}
			fflush(stderr);
		}
		VLOG_F(g_internal_verbosity, "arguments: " LOGURU_FMT(s) "", s_arguments.c_str());
		if (strlen(s_current_dir) != 0)
		{
			VLOG_F(g_internal_verbosity, "Current dir: " LOGURU_FMT(s) "", s_current_dir);
		}
		VLOG_F(g_internal_verbosity, "stderr verbosity: " LOGURU_FMT(d) "", g_stderr_verbosity);
		VLOG_F(g_internal_verbosity, "-----------------------------------");

		install_signal_handlers(options.signals);

		atexit(on_atexit);
	}